

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_base.h
# Opt level: O0

void __thiscall
LineBase2D<float>::LineBase2D
          (LineBase2D<float> *this,PointBase2D<float> *point1,PointBase2D<float> *point2)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  float *in_RDX;
  float *in_RSI;
  undefined8 *in_RDI;
  double dVar5;
  float length;
  float yDiff;
  float xDiff;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  PointBase2D<float> local_20;
  float *local_18;
  float *local_10;
  
  *in_RDI = *(undefined8 *)in_RSI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  PointBase2D<float>::PointBase2D((PointBase2D<float> *)(in_RDI + 1),0.0,0.0);
  bVar4 = PointBase2D<float>::operator==
                    ((PointBase2D<float> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (PointBase2D<float> *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (bVar4) {
    PointBase2D<float>::PointBase2D(&local_20,1.0,0.0);
    *(PointBase2D<float> *)(in_RDI + 1) = local_20;
  }
  else {
    fVar1 = *local_18 - *local_10;
    fVar2 = local_18[1] - local_10[1];
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),
                             ZEXT416((uint)(fVar2 * fVar2)));
    dVar5 = std::sqrt(auVar3._0_8_);
    PointBase2D<float>::PointBase2D
              ((PointBase2D<float> *)&stack0xffffffffffffffcc,fVar1 / SUB84(dVar5,0),
               fVar2 / SUB84(dVar5,0));
    in_RDI[1] = CONCAT44(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

LineBase2D( const PointBase2D<_Type> & point1 = PointBase2D<_Type>(), const PointBase2D<_Type> & point2 = PointBase2D<_Type>() )
        : _position( point1 )
    {
        if ( point1 == point2 ) {
            _direction = PointBase2D<_Type>( 1, 0 ); // we could raise an exception here instead
        }
        else {
            const _Type xDiff = point2.x - point1.x;
            const _Type yDiff = point2.y - point1.y;
            const _Type length = std::sqrt( xDiff * xDiff + yDiff * yDiff ); // here we might need more specific code for non-double cases
            _direction = PointBase2D<_Type>( xDiff / length, yDiff / length );
        }
    }